

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O0

void __thiscall slack::_detail::Slacking::checkResponse(Slacking *this,string *method,Json *json)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  ostream *poVar4;
  allocator local_91;
  string local_90 [32];
  undefined1 local_70 [8];
  string_t reason;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40 [2];
  Json *local_20;
  Json *json_local;
  string *method_local;
  Slacking *this_local;
  
  local_20 = json;
  json_local = (Json *)method;
  method_local = &this->base_url;
  ignore_unused_parameter<std::__cxx11::string>(method);
  sVar2 = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::count<char_const(&)[3]>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)local_20,(char (*) [3])"ok");
  if (sVar2 != 0) {
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)local_20,"ok");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::dump(local_40,(int)pvVar3,-1,true,strict);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"true");
    std::__cxx11::string::~string((string *)local_40);
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cout,"<< ");
      poVar4 = std::operator<<(poVar4,(string *)json_local);
      std::operator<<(poVar4," [passed]\n");
    }
    else {
      sVar2 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::count<char_const(&)[6]>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)local_20,(char (*) [6])0x194252);
      if (sVar2 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_90,"checkResponse() unknown error.",&local_91);
        trigger_error(this,(string *)local_90);
        std::__cxx11::string::~string(local_90);
        std::allocator<char>::~allocator((allocator<char> *)&local_91);
      }
      else {
        pvVar3 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)local_20,"error");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::dump((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_70,(int)pvVar3,-1,true,strict);
        trigger_error(this,(string *)local_70);
        poVar4 = std::operator<<((ostream *)&std::cerr,"<< checkResponse() error details: ");
        poVar4 = nlohmann::operator<<(poVar4,local_20);
        std::ostream::operator<<((ostream *)poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)local_70);
      }
    }
  }
  return;
}

Assistant:

void checkResponse(const std::string& method, const Json& json) {
        ignore_unused_parameter(method);
        if (json.count("ok")) {
            if(json["ok"].dump() == "true") {
#if SLACKING_VERBOSE_OUTPUT
                std::cout << "<< " << method << " [passed]\n";
#endif
            }
            else {
                if (json.count("error")) {
                    auto reason = json["error"].dump();
                    trigger_error(reason);
#if SLACKING_VERBOSE_OUTPUT
                    std::cerr << "<< checkResponse() error details: " << json << std::endl;
#endif
                }
                else {
                    trigger_error("checkResponse() unknown error.");
                }
            }
        }
    }